

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

optional<pbrt::LightLiSample> * __thiscall
pbrt::ImageInfiniteLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,ImageInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  Vector3f VVar18;
  Vector3<float> VVar19;
  Point3f PVar20;
  SampledSpectrum SVar21;
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Tuple2<pbrt::Point2,_float> local_38;
  Tuple3<pbrt::Vector3,_float> local_30;
  undefined1 extraout_var [56];
  undefined1 auVar13 [56];
  undefined1 auVar16 [56];
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_38 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7._0_16_);
  auVar8._0_8_ = PiecewiseConstant2D::Sample
                           (&this->distribution + (mode == WithMIS),(Point2f *)&local_38,&local_6c);
  auVar8._8_56_ = extraout_var;
  auVar16 = ZEXT856(0);
  local_68 = auVar8._0_16_;
  if ((local_6c != 0.0) || (NAN(local_6c))) {
    auVar13 = extraout_var;
    VVar18 = EqualAreaSquareToSphere(auVar8._0_8_);
    local_30.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar13;
    local_30._0_8_ = vmovlps_avx(auVar9._0_16_);
    VVar19 = Transform::operator()
                       (&(this->super_LightBase).renderFromLight,(Vector3<float> *)&local_30);
    auVar10._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar13;
    local_58 = auVar10._0_16_;
    auVar13 = ZEXT856((ulong)local_68._8_8_);
    SVar21 = Le(this,(Point2f)local_68._0_8_,&lambda);
    auVar15._0_8_ = SVar21.values.values._8_8_;
    auVar15._8_56_ = auVar16;
    auVar11._0_8_ = SVar21.values.values._0_8_;
    auVar11._8_56_ = auVar13;
    local_68 = auVar11._0_16_;
    local_48 = auVar15._0_16_;
    PVar20 = LightSampleContext::p(&ctx);
    auVar12._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar13;
    fVar1 = this->sceneRadius;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    bVar5 = true;
    fVar1 = fVar1 + fVar1;
    auVar6 = vmovshdup_avx(local_58);
    fVar3 = PVar20.super_Tuple3<pbrt::Point3,_float>.x + local_58._0_4_ * fVar1;
    auVar17 = vmovshdup_avx(auVar12._0_16_);
    fVar4 = PVar20.super_Tuple3<pbrt::Point3,_float>.z +
            VVar19.super_Tuple3<pbrt::Vector3,_float>.z * fVar1;
    fVar1 = auVar17._0_4_ + auVar6._0_4_ * fVar1;
    auVar17._4_4_ = fVar3;
    auVar17._0_4_ = fVar3;
    auVar17._8_4_ = fVar3;
    auVar17._12_4_ = fVar3;
    auVar14._4_4_ = fVar4;
    auVar14._0_4_ = fVar4;
    auVar14._8_4_ = fVar4;
    auVar14._12_4_ = fVar4;
    auVar6._4_4_ = fVar1;
    auVar6._0_4_ = fVar1;
    auVar6._8_4_ = fVar1;
    auVar6._12_4_ = fVar1;
    auVar6 = vmovlhps_avx(auVar17,auVar6);
    *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) = ZEXT432(0) << 0x20
    ;
    auVar17 = vunpcklpd_avx(local_68,local_48);
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar17;
    uVar2 = vmovlps_avx(local_58);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
         VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = local_6c / 12.566371;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar6;
    uVar2 = vmovlps_avx(auVar14);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         &(this->super_LightBase).mediumInterface;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  }
  else {
    bVar5 = false;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  __return_storage_ptr__->set = bVar5;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        // Find $(u,v)$ sample coordinates in infinite light texture
        Float mapPDF;
        Point2f uv = (mode == LightSamplingMode::WithMIS)
                         ? compensatedDistribution.Sample(u, &mapPDF)
                         : distribution.Sample(u, &mapPDF);
        if (mapPDF == 0)
            return {};

        // Convert infinite light sample point to direction
        Vector3f wl = EqualAreaSquareToSphere(uv);
        Vector3f wi = renderFromLight(wl);

        // Compute PDF for sampled infinite light direction
        Float pdf = mapPDF / (4 * Pi);

        // Return radiance value for infinite light direction
        return LightLiSample(
            Le(uv, lambda), wi, pdf,
            Interaction(ctx.p() + wi * (2 * sceneRadius), &mediumInterface));
    }